

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_treeops.c
# Opt level: O3

nbt_list * clone_list(nbt_list *list)

{
  list_head *plVar1;
  nbt_list *list_00;
  nbt_node *pnVar2;
  undefined8 *__ptr;
  nbt_node *pnVar3;
  int *piVar4;
  list_head *plVar5;
  list_head *plVar6;
  
  if (list == (nbt_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_treeops.c",
                  0x53,"struct nbt_list *clone_list(struct nbt_list *)");
  }
  list_00 = (nbt_list *)malloc(0x18);
  if (list_00 == (nbt_list *)0x0) {
LAB_00104330:
    piVar4 = __errno_location();
    *piVar4 = -2;
LAB_0010433b:
    nbt_free_list(list_00);
    list_00 = (nbt_list *)0x0;
  }
  else {
    plVar5 = &list_00->entry;
    (list_00->entry).blink = plVar5;
    (list_00->entry).flink = plVar5;
    list_00->data = (nbt_node *)0x0;
    pnVar3 = list->data;
    if (pnVar3 != (nbt_node *)0x0) {
      pnVar2 = (nbt_node *)malloc(0x20);
      list_00->data = pnVar2;
      if (pnVar2 == (nbt_node *)0x0) goto LAB_00104330;
      pnVar2->type = pnVar3->type;
    }
    for (plVar6 = (list->entry).flink; plVar6 != &list->entry; plVar6 = plVar6->flink) {
      __ptr = (undefined8 *)malloc(0x18);
      if (__ptr == (undefined8 *)0x0) goto LAB_00104330;
      pnVar3 = nbt_clone((nbt_node *)plVar6[-1].flink);
      *__ptr = pnVar3;
      if (pnVar3 == (nbt_node *)0x0) {
        free(__ptr);
        goto LAB_0010433b;
      }
      __ptr[2] = plVar5;
      plVar1 = plVar5->blink;
      __ptr[1] = plVar1;
      plVar5->blink = (list_head *)(__ptr + 1);
      plVar1->flink = (list_head *)(__ptr + 1);
    }
  }
  return list_00;
}

Assistant:

static struct nbt_list* clone_list(struct nbt_list* list)
{
    /* even empty lists are valid pointers! */
    assert(list);

    struct nbt_list* ret;
    CHECKED_MALLOC(ret, sizeof *ret, goto clone_error);

    INIT_LIST_HEAD(&ret->entry);

    ret->data = NULL;

    if(list->data != NULL)
    {
        CHECKED_MALLOC(ret->data, sizeof *ret->data, goto clone_error);
        ret->data->type = list->data->type;
    }

    struct list_head* pos;
    list_for_each(pos, &list->entry)
    {
        struct nbt_list* current = list_entry(pos, struct nbt_list, entry);
        struct nbt_list* new;

        CHECKED_MALLOC(new, sizeof *new, goto clone_error);

        new->data = nbt_clone(current->data);

        if(new->data == NULL)
        {
            free(new);
            goto clone_error;
        }

        list_add_tail(&new->entry, &ret->entry);
    }

    return ret;

clone_error:
    nbt_free_list(ret);
    return NULL;
}